

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrawfont.cpp
# Opt level: O2

QRawFont __thiscall QRawFont::fromFont(QRawFont *this,QFont *font,WritingSystem writingSystem)

{
  long lVar1;
  QFontPrivate *this_00;
  int script;
  HintingPreference HVar2;
  QFontEngine *pQVar3;
  long lVar4;
  ulong uVar5;
  undefined8 *puVar6;
  QFontDef *pQVar7;
  QFontEngine *pQVar8;
  long in_FS_OFFSET;
  byte bVar9;
  QFontDef request;
  
  bVar9 = 0;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  (this->d).d.ptr = (QRawFontPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  QRawFont(this);
  this_00 = (font->d).d.ptr;
  script = qt_script_for_writing_system(writingSystem);
  pQVar3 = QFontPrivate::engineForScript(this_00,script);
  if (pQVar3 != (QFontEngine *)0x0) {
    if (pQVar3->m_type == Multi) {
      pQVar8 = (QFontEngine *)**(undefined8 **)&pQVar3[1].m_type;
      if (3 < script) {
        puVar6 = &DAT_005f9860;
        pQVar7 = &request;
        for (lVar4 = 0xd; lVar4 != 0; lVar4 = lVar4 + -1) {
          *(undefined8 *)pQVar7 = *puVar6;
          puVar6 = puVar6 + (ulong)bVar9 * -2 + 1;
          pQVar7 = (QFontDef *)((long)pQVar7 + ((ulong)bVar9 * -2 + 1) * 8);
        }
        QFontDef::QFontDef(&request,&pQVar3->fontDef);
        request._97_1_ = request._97_1_ | 0x80;
        pQVar3 = QFontDatabasePrivate::findFont(&request,script,true);
        if (pQVar3 != (QFontEngine *)0x0) {
          uVar5 = (ulong)(uint6)request._98_6_ << 0x10 & 0x3ff0000000000;
          if (0x1900000000000 < uVar5) {
            *(ulong *)&(pQVar3->fontDef).field_0x60 =
                 *(ulong *)&(pQVar3->fontDef).field_0x60 & 0xfffc00ffffffffff | uVar5;
          }
          uVar5 = (ulong)(uint6)request._98_6_ << 0x10 & 0x30000000;
          pQVar8 = pQVar3;
          if (uVar5 != 0) {
            *(ulong *)&(pQVar3->fontDef).field_0x60 =
                 *(ulong *)&(pQVar3->fontDef).field_0x60 & 0xffffffffcfffffff | uVar5;
          }
        }
        QFontDef::~QFontDef(&request);
      }
      pQVar3 = pQVar8;
      if (pQVar3 == (QFontEngine *)0x0) goto LAB_00445aa8;
    }
    QRawFontPrivate::setFontEngine((this->d).d.ptr,pQVar3);
    HVar2 = QFont::hintingPreference(font);
    ((this->d).d.ptr)->hintingPreference = HVar2;
  }
LAB_00445aa8:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (QExplicitlySharedDataPointer<QRawFontPrivate>)
         (QExplicitlySharedDataPointer<QRawFontPrivate>)this;
}

Assistant:

QRawFont QRawFont::fromFont(const QFont &font, QFontDatabase::WritingSystem writingSystem)
{
    QRawFont rawFont;
    const QFontPrivate *font_d = QFontPrivate::get(font);
    int script = qt_script_for_writing_system(writingSystem);
    QFontEngine *fe = font_d->engineForScript(script);

    if (fe != nullptr && fe->type() == QFontEngine::Multi) {
        QFontEngineMulti *multiEngine = static_cast<QFontEngineMulti *>(fe);
        fe = multiEngine->engine(0);

        if (script > QChar::Script_Latin) {
            // keep in sync with QFontEngineMulti::loadEngine()
            QFontDef request(multiEngine->fontDef);
            request.styleStrategy |= QFont::NoFontMerging;

            if (QFontEngine *engine = QFontDatabasePrivate::findFont(request, script, true)) {
                if (request.weight > QFont::Normal)
                    engine->fontDef.weight = request.weight;
                if (request.style > QFont::StyleNormal)
                    engine->fontDef.style = request.style;
                fe = engine;
            }
        }
        Q_ASSERT(fe);
    }

    if (fe != nullptr) {
        rawFont.d.data()->setFontEngine(fe);
        rawFont.d.data()->hintingPreference = font.hintingPreference();
    }
    return rawFont;
}